

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstackedlayout.cpp
# Opt level: O0

QLayoutItem * __thiscall QStackedLayout::takeAt(QStackedLayout *this,int index)

{
  bool bVar1;
  int iVar2;
  QStackedLayoutPrivate *pQVar3;
  QList<QLayoutItem_*> *this_00;
  qsizetype qVar4;
  QLayoutItem *pQVar5;
  undefined4 extraout_var;
  int in_ESI;
  QStackedLayout *unaff_retaddr;
  int newIndex;
  QLayoutItem *item;
  QStackedLayoutPrivate *d;
  int in_stack_ffffffffffffffac;
  qsizetype in_stack_ffffffffffffffb8;
  undefined8 in_stack_fffffffffffffff8;
  
  iVar2 = (int)((ulong)in_stack_fffffffffffffff8 >> 0x20);
  pQVar3 = d_func((QStackedLayout *)0x34fde0);
  if (-1 < in_ESI) {
    this_00 = (QList<QLayoutItem_*> *)(long)in_ESI;
    qVar4 = QList<QLayoutItem_*>::size(&pQVar3->list);
    if ((long)this_00 < qVar4) {
      pQVar5 = QList<QLayoutItem_*>::takeAt(this_00,in_stack_ffffffffffffffb8);
      if (in_ESI == pQVar3->index) {
        pQVar3->index = -1;
        qVar4 = QList<QLayoutItem_*>::size(&pQVar3->list);
        if (qVar4 < 1) {
          currentChanged((QStackedLayout *)0x34fedc,in_stack_ffffffffffffffac);
        }
        else {
          QList<QLayoutItem_*>::size(&pQVar3->list);
          setCurrentIndex(unaff_retaddr,iVar2);
        }
      }
      else if (in_ESI < pQVar3->index) {
        pQVar3->index = pQVar3->index + -1;
      }
      widgetRemoved((QStackedLayout *)0x34ff13,in_stack_ffffffffffffffac);
      iVar2 = (*pQVar5->_vptr_QLayoutItem[0xd])();
      if (CONCAT44(extraout_var,iVar2) == 0) {
        return pQVar5;
      }
      (*pQVar5->_vptr_QLayoutItem[0xd])();
      bVar1 = qt_wasDeleted((QWidget *)0x34ff37);
      if (bVar1) {
        return pQVar5;
      }
      (*pQVar5->_vptr_QLayoutItem[0xd])();
      QWidget::hide((QWidget *)0x34ff4e);
      return pQVar5;
    }
  }
  return (QLayoutItem *)0x0;
}

Assistant:

QLayoutItem *QStackedLayout::takeAt(int index)
{
    Q_D(QStackedLayout);
    if (index <0 || index >= d->list.size())
        return nullptr;
    QLayoutItem *item = d->list.takeAt(index);
    if (index == d->index) {
        d->index = -1;
        if ( d->list.size() > 0 ) {
            int newIndex = (index == d->list.size()) ? index-1 : index;
            setCurrentIndex(newIndex);
        } else {
            emit currentChanged(-1);
        }
    } else if (index < d->index) {
        --d->index;
    }
    emit widgetRemoved(index);
    if (item->widget() && !qt_wasDeleted(item->widget()))
        item->widget()->hide();
    return item;
}